

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void delete_bb(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  out_edge_t peVar1;
  in_edge_t peVar2;
  loop_node_t plVar3;
  loop_node_t plVar4;
  loop_node_t plVar5;
  DLIST_LINK_loop_node_t *pDVar6;
  out_edge_t e;
  in_edge_t_conflict e_00;
  loop_node_t_conflict plVar7;
  
  e = (bb->out_edges).head;
  while (e != (edge_t_conflict)0x0) {
    peVar1 = (e->out_link).next;
    delete_edge(e);
    e = peVar1;
  }
  e_00 = (bb->in_edges).head;
  while (e_00 != (edge_t_conflict)0x0) {
    peVar2 = (e_00->in_link).next;
    delete_edge(e_00);
    e_00 = peVar2;
  }
  plVar7 = bb->loop_node;
  if (plVar7 != (loop_node_t_conflict)0x0) {
    plVar3 = plVar7->parent;
    if (plVar3->entry == plVar7) {
      plVar3->entry = (loop_node_t)0x0;
    }
    plVar4 = (plVar7->children_link).prev;
    if (plVar4 == (loop_node_t)0x0) {
      if ((plVar3->children).head != plVar7) goto LAB_00137854;
      plVar5 = (plVar7->children_link).next;
      (plVar3->children).head = plVar5;
    }
    else {
      plVar5 = (plVar7->children_link).next;
      (plVar4->children_link).next = plVar5;
    }
    if (plVar5 == (loop_node_t)0x0) {
      if ((plVar3->children).tail != plVar7) {
LAB_00137854:
        dlist_assert_fail("remove","loop_node_t");
      }
      pDVar6 = (DLIST_LINK_loop_node_t *)&(plVar3->children).tail;
    }
    else {
      pDVar6 = &plVar5->children_link;
    }
    pDVar6->prev = plVar4;
    (plVar7->children_link).prev = (loop_node_t)0x0;
    (plVar7->children_link).next = (loop_node_t)0x0;
    plVar7 = bb->loop_node;
    if ((plVar7->u).preheader != (loop_node_t)0x0) {
      (((plVar7->u).preheader)->u).preheader = (loop_node_t)0x0;
      plVar7 = bb->loop_node;
    }
    free(plVar7);
  }
  DLIST_bb_t_remove(&gen_ctx->curr_cfg->bbs,bb);
  bitmap_destroy(bb->in);
  bitmap_destroy(bb->out);
  bitmap_destroy(bb->gen);
  bitmap_destroy(bb->kill);
  bitmap_destroy(bb->dom_in);
  bitmap_destroy(bb->dom_out);
  free(bb);
  return;
}

Assistant:

static void delete_bb (gen_ctx_t gen_ctx, bb_t bb) {
  edge_t e, next_e;

  for (e = DLIST_HEAD (out_edge_t, bb->out_edges); e != NULL; e = next_e) {
    next_e = DLIST_NEXT (out_edge_t, e);
    delete_edge (e);
  }
  for (e = DLIST_HEAD (in_edge_t, bb->in_edges); e != NULL; e = next_e) {
    next_e = DLIST_NEXT (in_edge_t, e);
    delete_edge (e);
  }
  if (bb->loop_node != NULL) {
    if (bb->loop_node->parent->entry == bb->loop_node) bb->loop_node->parent->entry = NULL;
    DLIST_REMOVE (loop_node_t, bb->loop_node->parent->children, bb->loop_node);
    if (bb->loop_node->u.preheader_loop != NULL)
      bb->loop_node->u.preheader_loop->u.preheader = NULL;
    free (bb->loop_node);
  }
  DLIST_REMOVE (bb_t, curr_cfg->bbs, bb);
  bitmap_destroy (bb->in);
  bitmap_destroy (bb->out);
  bitmap_destroy (bb->gen);
  bitmap_destroy (bb->kill);
  bitmap_destroy (bb->dom_in);
  bitmap_destroy (bb->dom_out);
  free (bb);
}